

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_art.hpp
# Opt level: O2

node_type_counter_array * __thiscall
unodb::
mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
::get_node_counts(node_type_counter_array *__return_storage_ptr__,
                 mutex_db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>
                 *this)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  
  std::mutex::lock(&this->mutex);
  __return_storage_ptr__->_M_elems[4] = (this->db_).node_counts._M_elems[4];
  uVar1 = (this->db_).node_counts._M_elems[1];
  uVar2 = (this->db_).node_counts._M_elems[2];
  uVar3 = (this->db_).node_counts._M_elems[3];
  __return_storage_ptr__->_M_elems[0] = (this->db_).node_counts._M_elems[0];
  __return_storage_ptr__->_M_elems[1] = uVar1;
  __return_storage_ptr__->_M_elems[2] = uVar2;
  __return_storage_ptr__->_M_elems[3] = uVar3;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] auto get_node_counts() const {
    const std::lock_guard guard{mutex};
    return db_.get_node_counts();
  }